

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void test_all_maps<HashObject<8,8>>(int obj_size,int iters)

{
  int in_EDI;
  bool stress_hash_function;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  
  uVar1 = in_EDI < 9;
  if (FLAGS_test_sparse_hash_map) {
    measure_map<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>,EasyUseSparseHashMap<HashObject<8,8>*,int,HashFn>>
              ((char *)CONCAT17(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8,false);
  }
  if ((FLAGS_test_dense_hash_map & 1U) != 0) {
    measure_map<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>,EasyUseDenseHashMap<HashObject<8,8>*,int,HashFn>>
              ((char *)CONCAT17(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8,false);
  }
  if ((FLAGS_test_hash_map & 1U) != 0) {
    measure_map<EasyUseHashMap<HashObject<8,8>,int,HashFn>,EasyUseHashMap<HashObject<8,8>*,int,HashFn>>
              ((char *)CONCAT17(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8,false);
  }
  if ((FLAGS_test_map & 1U) != 0) {
    measure_map<EasyUseMap<HashObject<8,8>,int>,EasyUseMap<HashObject<8,8>*,int>>
              ((char *)CONCAT17(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8,false);
  }
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}